

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v7::detail::
arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
::operator()(arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
             *this,basic_string_view<char> value)

{
  format_specs *pfVar1;
  iterator iVar2;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *it;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out;
  basic_format_specs<char> *in_R8;
  basic_string_view<char> s;
  
  s.data_ = (char *)value.size_;
  out.container = (buffer<char> *)value.data_;
  pfVar1 = this->specs_;
  if (pfVar1 == (format_specs *)0x0) {
    iVar2.container =
         (buffer<char> *)
         std::__copy_move<false,false,std::random_access_iterator_tag>::
         __copy_m<char_const*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                   ((char *)out.container,s.data_ + (long)out.container,(this->out_).container);
  }
  else {
    if ((pfVar1->type != '\0') && (pfVar1->type != 's')) {
      error_handler::on_error((error_handler *)this,"invalid type specifier");
    }
    s.size_ = (size_t)pfVar1;
    iVar2.container =
         (buffer<char> *)
         write<char,char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                   ((this->out_).container,out,s,in_R8);
  }
  (this->out_).container = iVar2.container;
  return (iterator)iVar2.container;
}

Assistant:

iterator operator()(basic_string_view<Char> value) {
    if (specs_) {
      check_string_type_spec(specs_->type, error_handler());
      write(value, *specs_);
    } else {
      write(value);
    }
    return out_;
  }